

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_2::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,ResourceDescription *resourceDesc,
          OperationSupport *writeOp,OperationSupport *readOp,PipelineCacheData *pipelineCacheData)

{
  PipelineCacheData *pipelineCacheData_00;
  ResourceDescription *context_00;
  MultiQueues *pMVar1;
  OperationContext *this_00;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DefaultDeleter<vkt::synchronization::OperationContext> local_46;
  DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues> local_45 [13];
  PipelineCacheData *local_38;
  PipelineCacheData *pipelineCacheData_local;
  OperationSupport *readOp_local;
  OperationSupport *writeOp_local;
  ResourceDescription *resourceDesc_local;
  Context *context_local;
  BaseTestInstance_conflict *this_local;
  
  local_38 = pipelineCacheData;
  pipelineCacheData_local = (PipelineCacheData *)readOp;
  readOp_local = writeOp;
  writeOp_local = (OperationSupport *)resourceDesc;
  resourceDesc_local = (ResourceDescription *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_0166f8c8;
  pMVar1 = (MultiQueues *)operator_new(0x68);
  MultiQueues::MultiQueues(pMVar1,(Context *)resourceDesc_local);
  de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>::DefaultDeleter
            (local_45);
  de::details::
  UniquePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
  ::UniquePtr((UniquePtr<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
               *)&this->m_opContext,pMVar1);
  this_00 = (OperationContext *)operator_new(0x40);
  context_00 = resourceDesc_local;
  pipelineCacheData_00 = local_38;
  pMVar1 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                         *)&this->m_opContext);
  vk = MultiQueues::getDeviceInterface(pMVar1);
  pMVar1 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                         *)&this->m_opContext);
  device = MultiQueues::getDevice(pMVar1);
  pMVar1 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
           ::operator->((UniqueBase<vkt::synchronization::(anonymous_namespace)::MultiQueues,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::MultiQueues>_>
                         *)&this->m_opContext);
  allocator = MultiQueues::getAllocator(pMVar1);
  OperationContext::OperationContext
            (this_00,(Context *)context_00,pipelineCacheData_00,vk,device,allocator);
  de::DefaultDeleter<vkt::synchronization::OperationContext>::DefaultDeleter(&local_46);
  de::details::
  UniquePtr<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
  ::UniquePtr((UniquePtr<vkt::synchronization::OperationContext,_de::DefaultDeleter<vkt::synchronization::OperationContext>_>
               *)&(this->m_opContext).m_physicalDevice,this_00);
  ResourceDescription::ResourceDescription
            ((ResourceDescription *)&(this->m_opContext).m_allocator,
             (ResourceDescription *)writeOp_local);
  (this->m_resource).
  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  .m_data.ptr = (Resource *)readOp_local;
  *(PipelineCacheData **)
   &(this->m_resource).
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.field_0x8 = pipelineCacheData_local;
  return;
}

Assistant:

BaseTestInstance (Context& context, const ResourceDescription& resourceDesc, const OperationSupport& writeOp, const OperationSupport& readOp, PipelineCacheData& pipelineCacheData)
		: TestInstance		(context)
		, m_queues			(new MultiQueues(context))
		, m_opContext		(new OperationContext(context, pipelineCacheData, m_queues->getDeviceInterface(), m_queues->getDevice(), m_queues->getAllocator()))
		, m_resourceDesc	(resourceDesc)
		, m_writeOp			(writeOp)
		, m_readOp			(readOp)
	{
	}